

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O3

REF_STATUS ref_split_pass(REF_GRID ref_grid)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  REF_INT node0;
  REF_INT node1;
  uint uVar4;
  REF_STATUS RVar5;
  REF_DBL *pRVar6;
  REF_INT *pRVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  uint n;
  REF_MPI ref_mpi;
  undefined4 uVar12;
  undefined8 unaff_R13;
  REF_EDGE pRVar13;
  REF_NODE pRVar14;
  REF_CELL pRVar15;
  long lVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  REF_INT new_node;
  REF_CAVITY ref_cavity;
  REF_BOOL allowed;
  REF_SUBDIV ref_subdiv;
  REF_LIST para_no_geom;
  REF_EDGE ref_edge;
  REF_BOOL has_edge;
  REF_LIST para_cavity;
  REF_DBL ratio01;
  REF_INT n_cavity;
  REF_BOOL allowed_tri_quality;
  REF_BOOL allowed_cavity_ratio;
  REF_BOOL geom_support;
  REF_BOOL allowed_local;
  REF_BOOL allowed_tet_quality;
  REF_BOOL allowed_tri_conformity;
  REF_BOOL allowed_ratio;
  REF_DBL ratio1;
  REF_DBL ratio0;
  REF_GLOB global;
  REF_DBL min_add;
  REF_DBL min_del;
  REF_INT local_120;
  int local_11c;
  REF_CAVITY local_118;
  int local_10c;
  long local_108;
  REF_NODE local_100;
  undefined4 local_f4;
  REF_SUBDIV local_f0;
  REF_LIST local_e8;
  REF_EDGE local_e0;
  int local_d4;
  REF_MPI local_d0;
  REF_INT *local_c8;
  REF_DBL *local_c0;
  REF_LIST local_b8;
  double local_b0;
  long local_a8;
  void *local_a0;
  double local_98;
  uint local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  long local_68;
  REF_CELL local_60;
  double local_58;
  double local_50;
  REF_GLOB local_48;
  double local_40;
  REF_DBL local_38;
  
  ref_mpi = ref_grid->mpi;
  pRVar14 = ref_grid->node;
  local_118 = (REF_CAVITY)0x0;
  local_e8 = (REF_LIST)0x0;
  local_b8 = (REF_LIST)0x0;
  local_f0 = (REF_SUBDIV)0x0;
  if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
    pRVar15 = ref_grid->cell[8];
    if (ref_mpi->n < 2) goto LAB_001e3e24;
    uVar4 = ref_list_create(&local_e8);
    if (uVar4 != 0) {
      uVar9 = (ulong)uVar4;
      pcVar11 = "list for stuck edges";
      uVar8 = 0x6d;
      goto LAB_001e3e5b;
    }
    uVar4 = ref_list_create(&local_b8);
    if (uVar4 != 0) {
      uVar9 = (ulong)uVar4;
      pcVar11 = "list for stuck cavity";
      uVar8 = 0x6e;
      goto LAB_001e3e5b;
    }
    uVar12 = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  }
  else {
    pRVar15 = ref_grid->cell[3];
LAB_001e3e24:
    uVar12 = 0;
  }
  uVar4 = ref_edge_create(&local_e0,ref_grid);
  pRVar13 = local_e0;
  if (uVar4 != 0) {
    uVar9 = (ulong)uVar4;
    pcVar11 = "orig edges";
    uVar8 = 0x71;
    goto LAB_001e3e5b;
  }
  iVar2 = local_e0->n;
  lVar16 = (long)iVar2;
  local_f4 = uVar12;
  local_60 = pRVar15;
  if (lVar16 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x73,
           "ref_split_pass","malloc ratio of REF_DBL negative");
    return 1;
  }
  pRVar6 = (REF_DBL *)malloc(lVar16 * 8);
  if (pRVar6 == (REF_DBL *)0x0) {
    pcVar11 = "malloc ratio of REF_DBL NULL";
    uVar8 = 0x73;
LAB_001e487a:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar8,
           "ref_split_pass",pcVar11);
    return 2;
  }
  local_c0 = pRVar6;
  pRVar7 = (REF_INT *)malloc(lVar16 * 4);
  if (pRVar7 == (REF_INT *)0x0) {
    pcVar11 = "malloc order of REF_INT NULL";
    uVar8 = 0x74;
    goto LAB_001e487a;
  }
  local_c8 = pRVar7;
  local_a0 = malloc(lVar16 * 4);
  if (local_a0 == (void *)0x0) {
    pcVar11 = "malloc edges of REF_INT NULL";
    uVar8 = 0x75;
    local_a0 = (void *)0x0;
    goto LAB_001e487a;
  }
  if (iVar2 == 0) {
    uVar4 = ref_sort_heap_dbl(0,local_c0,local_c8);
    if (uVar4 != 0) goto LAB_001e48da;
  }
  else {
    lVar16 = 0;
    n = 0;
    local_100 = pRVar14;
    local_d0 = ref_mpi;
    do {
      pRVar6 = local_c0 + (int)n;
      uVar4 = ref_node_ratio(local_100,pRVar13->e2n[lVar16 * 2],pRVar13->e2n[lVar16 * 2 + 1],pRVar6)
      ;
      if (uVar4 != 0) {
        uVar9 = (ulong)uVar4;
        pcVar11 = "ratio";
        uVar8 = 0x7b;
        goto LAB_001e3e5b;
      }
      dVar20 = *pRVar6;
      pRVar6 = &ref_grid->adapt->split_ratio;
      if (*pRVar6 <= dVar20 && dVar20 != *pRVar6) {
        *(int *)((long)local_a0 + (long)(int)n * 4) = (int)lVar16;
        n = n + 1;
      }
      lVar16 = lVar16 + 1;
      pRVar13 = local_e0;
    } while (lVar16 < local_e0->n);
    uVar4 = ref_sort_heap_dbl(n,local_c0,local_c8);
    if (uVar4 != 0) {
LAB_001e48da:
      uVar9 = (ulong)uVar4;
      pcVar11 = "sort lengths";
      uVar8 = 0x82;
      goto LAB_001e3e5b;
    }
    ref_mpi = local_d0;
    if (0 < (int)n) {
      uVar10 = (ulong)n + 1;
      do {
        iVar2 = *(int *)((long)local_a0 + (long)local_c8[uVar10 - 2] * 4);
        lVar16 = (long)iVar2;
        local_11c = local_e0->e2n[lVar16 * 2];
        iVar2 = local_e0->e2n[iVar2 * 2 + 1];
        uVar4 = ref_cell_has_side(local_60,local_11c,iVar2,&local_10c);
        pRVar14 = local_100;
        if (uVar4 != 0) {
          uVar9 = (ulong)uVar4;
          pcVar11 = "has side";
          uVar8 = 0x8c;
          goto LAB_001e3e5b;
        }
        local_68 = lVar16;
        if (local_10c != 0) {
          local_a8 = (long)local_11c;
          iVar3 = local_100->ref_mpi->id;
          if ((iVar3 == local_100->part[local_a8]) || (iVar3 == local_100->part[iVar2])) {
            local_108 = (long)iVar2;
            uVar4 = ref_split_edge_mixed(ref_grid,local_11c,iVar2,&local_10c);
            iVar3 = local_11c;
            if (uVar4 != 0) {
              uVar9 = (ulong)uVar4;
              pcVar11 = "mixed";
              uVar8 = 0x96;
              goto LAB_001e3e5b;
            }
            if (local_10c != 0) {
              local_70 = uVar10;
              if ((ref_grid->twod != 0) || (dVar20 = 0.5, ref_grid->surf != 0)) {
                uVar4 = ref_node_ratio(pRVar14,local_11c,iVar2,&local_98);
                if (uVar4 != 0) {
                  uVar9 = (ulong)uVar4;
                  pcVar11 = "ratio01";
                  uVar8 = 0x9c;
                  goto LAB_001e3e5b;
                }
                uVar4 = ref_node_ratio_node0(pRVar14,iVar3,(REF_INT)local_108,&local_50);
                if (uVar4 != 0) {
                  uVar9 = (ulong)uVar4;
                  pcVar11 = "ratio0";
                  uVar8 = 0x9d;
                  goto LAB_001e3e5b;
                }
                uVar4 = ref_node_ratio_node0(pRVar14,iVar2,iVar3,&local_58);
                if (uVar4 != 0) {
                  uVar9 = (ulong)uVar4;
                  pcVar11 = "ratio1";
                  uVar8 = 0x9e;
                  goto LAB_001e3e5b;
                }
                auVar18._0_8_ = local_58 * 1e+20 + local_50;
                auVar18._8_8_ = local_50;
                auVar19._8_8_ = -local_50;
                auVar19._0_8_ = -auVar18._0_8_;
                auVar19 = maxpd(auVar18,auVar19);
                dVar20 = 0.5;
                pRVar14 = local_100;
                if (auVar19._8_8_ < auVar19._0_8_) {
                  dVar20 = local_50 / (local_58 + local_50);
                  if ((dVar20 <= 0.25) || (0.75 <= dVar20)) {
                    dVar21 = local_98 * 1e+20;
                    if (dVar21 <= -dVar21) {
                      dVar21 = -dVar21;
                    }
                    if (local_58 <= local_50) {
                      dVar17 = local_58;
                      if (local_58 <= -local_58) {
                        dVar17 = -local_58;
                      }
                      dVar20 = 0.5;
                      if (dVar17 < dVar21) {
                        dVar20 = local_58 / local_98;
                      }
                    }
                    else {
                      dVar20 = 0.5;
                      if (auVar19._8_8_ < dVar21) {
                        dVar20 = 1.0 - local_50 / local_98;
                      }
                    }
                  }
                  else {
                    dVar20 = 1.0 - dVar20;
                  }
                }
              }
              local_b0 = dVar20;
              uVar4 = ref_node_next_global(pRVar14,&local_48);
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar11 = "next global";
                uVar8 = 0xb1;
                goto LAB_001e3e5b;
              }
              uVar4 = ref_node_add(pRVar14,local_48,&local_120);
              iVar3 = local_11c;
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar11 = "new node";
                uVar8 = 0xb2;
                goto LAB_001e3e5b;
              }
              dVar20 = 0.05;
              if (0.05 <= local_b0) {
                dVar20 = local_b0;
              }
              local_b0 = 0.95;
              if (dVar20 <= 0.95) {
                local_b0 = dVar20;
              }
              uVar4 = ref_node_interpolate_edge
                                (pRVar14,local_11c,(REF_INT)local_108,local_b0,local_120);
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar11 = "interp new node";
                uVar8 = 0xb5;
                goto LAB_001e3e5b;
              }
              uVar4 = ref_geom_add_between(ref_grid,iVar3,iVar2,local_b0,local_120);
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar11 = "geom new node";
                uVar8 = 0xb7;
                goto LAB_001e3e5b;
              }
              uVar4 = ref_geom_constrain(ref_grid,local_120);
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar11 = "geom constraint";
                uVar8 = 0xb8;
                goto LAB_001e3e5b;
              }
              uVar4 = ref_metric_interpolate_between
                                (ref_grid,local_11c,(REF_INT)local_108,local_120);
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar11 = "interp new node metric";
                uVar8 = 0xba;
                goto LAB_001e3e5b;
              }
              uVar4 = ref_geom_supported(ref_grid->geom,local_120,&local_84);
              iVar3 = local_11c;
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar11 = "geom support";
                uVar8 = 0xbc;
                goto LAB_001e3e5b;
              }
              uVar4 = ref_split_edge_tet_quality(ref_grid,local_11c,iVar2,local_120,&local_7c);
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar11 = "edge tet qual";
                uVar8 = 0xdf;
                goto LAB_001e3e5b;
              }
              uVar4 = ref_split_edge_tri_quality
                                (ref_grid,iVar3,(REF_INT)local_108,local_120,&local_8c);
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar11 = "quality of new tri";
                uVar8 = 0xe4;
                goto LAB_001e3e5b;
              }
              uVar4 = ref_split_edge_ratio(ref_grid,iVar3,iVar2,local_120,&local_74);
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar11 = "edge tet ratio";
                uVar8 = 0xe8;
                goto LAB_001e3e5b;
              }
              uVar4 = ref_split_edge_tri_conformity
                                (0,ref_grid,iVar3,(REF_INT)local_108,local_120,&local_78);
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar11 = "edge tri qual";
                uVar8 = 0xed;
                goto LAB_001e3e5b;
              }
              uVar4 = ref_cell_has_side(ref_grid->cell[0],iVar3,iVar2,&local_d4);
              uVar10 = local_70;
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar11 = "check for an edge";
                uVar8 = 0xf1;
                goto LAB_001e3e5b;
              }
              if ((((local_7c == 0) || (local_74 == 0)) || (local_78 == 0)) || (local_8c == 0)) {
                if (local_84 == 0) {
                  uVar4 = ref_node_remove(pRVar14,local_120);
                  if (uVar4 != 0) {
                    uVar9 = (ulong)uVar4;
                    pcVar11 = "remove new node";
                    uVar8 = 0xfa;
                    goto LAB_001e3e5b;
                  }
                  uVar4 = ref_geom_remove_all(ref_grid->geom,local_120);
                  if (uVar4 != 0) {
                    uVar9 = (ulong)uVar4;
                    pcVar11 = "rm";
                    uVar8 = 0xfb;
                    goto LAB_001e3e5b;
                  }
                }
                else {
                  uVar4 = ref_cavity_create(&local_118);
                  if (uVar4 != 0) {
                    uVar9 = (ulong)uVar4;
                    pcVar11 = "cav create";
                    uVar8 = 0x101;
                    goto LAB_001e3e5b;
                  }
                  local_118->debug = 0;
                  if ((ref_grid->surf != 0) && (local_d4 != 0)) {
                    uVar4 = ref_node_ratio(pRVar14,local_11c,(REF_INT)local_108,&local_98);
                    if (uVar4 != 0) {
                      uVar9 = (ulong)uVar4;
                      pcVar11 = "ratio01";
                      uVar8 = 0x104;
                      goto LAB_001e3e5b;
                    }
                    if (5.0 < local_98) {
                      local_118->min_normdev = 0.0;
                    }
                  }
                  uVar4 = ref_cavity_form_edge_split(local_118,ref_grid,local_11c,iVar2,local_120);
                  if (uVar4 != 0) {
                    uVar9 = (ulong)uVar4;
                    pcVar11 = "form edge split cav";
                    uVar8 = 0x109;
                    goto LAB_001e3e5b;
                  }
                  RVar5 = ref_cavity_enlarge_combined(local_118);
                  if (RVar5 != 0) {
                    uVar4 = ref_grid_tattle(ref_grid,local_11c);
                    if (uVar4 != 0) {
                      uVar9 = (ulong)uVar4;
                      pcVar11 = "tattle node0";
                      uVar8 = 0x112;
                      goto LAB_001e3e5b;
                    }
                    uVar4 = ref_grid_tattle(ref_grid,(REF_INT)local_108);
                    if (uVar4 != 0) {
                      uVar9 = (ulong)uVar4;
                      pcVar11 = "tattle node1";
                      uVar8 = 0x113;
                      goto LAB_001e3e5b;
                    }
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x114,"ref_split_pass","enlarge");
                  }
                  if (local_118->state == REF_CAVITY_VISIBLE) {
                    uVar4 = ref_cavity_ratio(local_118,&local_88);
                    if (uVar4 != 0) {
                      uVar9 = (ulong)uVar4;
                      pcVar11 = "cavity ratio";
                      uVar8 = 0x119;
                      goto LAB_001e3e5b;
                    }
                    uVar4 = ref_cavity_change(local_118,&local_38,&local_40);
                    if (uVar4 != 0) {
                      uVar9 = (ulong)uVar4;
                      pcVar11 = "cavity change";
                      uVar8 = 0x11a;
                      goto LAB_001e3e5b;
                    }
                    if ((local_d4 != 0 || local_88 != 0) &&
                       (pRVar6 = &ref_grid->adapt->split_quality_absolute,
                       *pRVar6 <= local_40 && local_40 != *pRVar6)) {
                      uVar4 = ref_cavity_replace(local_118);
                      if (uVar4 == 0) {
                        uVar4 = ref_cavity_free(local_118);
                        if (uVar4 == 0) {
                          local_118 = (REF_CAVITY)0x0;
                          pRVar7 = local_100->age;
                          pRVar7[local_a8] = 0;
                          pRVar7[local_108] = 0;
                          uVar4 = ref_smooth_post_edge_split(ref_grid,local_120);
                          uVar10 = local_70;
                          ref_mpi = local_d0;
                          if (uVar4 == 0) goto LAB_001e4786;
                          uVar9 = (ulong)uVar4;
                          pcVar11 = "smooth after split";
                          uVar8 = 300;
                        }
                        else {
                          uVar9 = (ulong)uVar4;
                          pcVar11 = "cav free";
                          uVar8 = 0x127;
                        }
                      }
                      else {
                        uVar9 = (ulong)uVar4;
                        pcVar11 = "cav replace";
                        uVar8 = 0x126;
                      }
                      goto LAB_001e3e5b;
                    }
                  }
                  if (((char)local_f4 == '\x01' &&
                       local_118->state == REF_CAVITY_PARTITION_CONSTRAINED) &&
                     (uVar4 = ref_list_push(local_b8,(REF_INT)local_68), uVar4 != 0)) {
                    uVar9 = (ulong)uVar4;
                    pcVar11 = "push";
                    uVar8 = 0x137;
                    goto LAB_001e3e5b;
                  }
                  uVar4 = ref_cavity_free(local_118);
                  if (uVar4 != 0) {
                    uVar9 = (ulong)uVar4;
                    pcVar11 = "cav free";
                    uVar8 = 0x139;
                    goto LAB_001e3e5b;
                  }
                  local_118 = (REF_CAVITY)0x0;
                  uVar4 = ref_node_remove(pRVar14,local_120);
                  if (uVar4 != 0) {
                    uVar9 = (ulong)uVar4;
                    pcVar11 = "remove new node";
                    uVar8 = 0x13b;
                    goto LAB_001e3e5b;
                  }
                  uVar4 = ref_geom_remove_all(ref_grid->geom,local_120);
                  if (uVar4 != 0) {
                    uVar9 = (ulong)uVar4;
                    pcVar11 = "rm";
                    uVar8 = 0x13c;
                    goto LAB_001e3e5b;
                  }
                }
              }
              else {
                uVar4 = ref_cell_local_gem(local_60,pRVar14,local_11c,iVar2,&local_80);
                lVar16 = local_108;
                if (uVar4 != 0) {
                  uVar9 = (ulong)uVar4;
                  pcVar11 = "local tet";
                  uVar8 = 0x141;
                  goto LAB_001e3e5b;
                }
                if (local_80 == 0) {
                  if ((char)local_f4 == '\0') {
                    pRVar7 = local_100->age;
                    piVar1 = pRVar7 + local_a8;
                    *piVar1 = *piVar1 + 1;
                    piVar1 = pRVar7 + local_108;
                    *piVar1 = *piVar1 + 1;
                  }
                  else {
                    uVar4 = ref_list_push(local_e8,(REF_INT)local_68);
                    if (uVar4 != 0) {
                      uVar9 = (ulong)uVar4;
                      pcVar11 = "push";
                      uVar8 = 0x144;
                      goto LAB_001e3e5b;
                    }
                  }
                  uVar4 = ref_node_remove(local_100,local_120);
                  if (uVar4 != 0) {
                    uVar9 = (ulong)uVar4;
                    pcVar11 = "remove new node";
                    uVar8 = 0x149;
                    goto LAB_001e3e5b;
                  }
                  uVar4 = ref_geom_remove_all(ref_grid->geom,local_120);
                  if (uVar4 != 0) {
                    uVar9 = (ulong)uVar4;
                    pcVar11 = "rm";
                    uVar8 = 0x14a;
                    goto LAB_001e3e5b;
                  }
                }
                else {
                  uVar4 = ref_split_edge(ref_grid,local_11c,(REF_INT)local_108,local_120);
                  if (uVar4 == 0) {
                    pRVar7 = local_100->age;
                    pRVar7[local_a8] = 0;
                    pRVar7[lVar16] = 0;
                    uVar4 = ref_smooth_post_edge_split(ref_grid,local_120);
                    if (uVar4 != 0) {
                      uVar9 = (ulong)uVar4;
                      pcVar11 = "smooth after split";
                      uVar8 = 0x15d;
                      goto LAB_001e3e5b;
                    }
                  }
                  else {
                    uVar9 = (ulong)uVar4;
                    if (uVar4 != 7) {
                      pcVar11 = "tet edge split";
                      uVar8 = 0x155;
                      goto LAB_001e3e5b;
                    }
                    uVar4 = ref_node_remove(local_100,local_120);
                    if (uVar4 != 0) {
                      uVar9 = (ulong)uVar4;
                      pcVar11 = "remove new node";
                      uVar8 = 0x151;
                      goto LAB_001e3e5b;
                    }
                    uVar4 = ref_geom_remove_all(ref_grid->geom,local_120);
                    if (uVar4 != 0) {
                      uVar9 = (ulong)uVar4;
                      pcVar11 = "rm";
                      uVar8 = 0x152;
                      goto LAB_001e3e5b;
                    }
                  }
                }
              }
            }
          }
        }
LAB_001e4786:
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
  }
  free(local_a0);
  free(local_c8);
  free(local_c0);
  if ((char)local_f4 != '\0') {
    if (0 < ref_grid->adapt->timing_level) {
      ref_mpi_stopwatch_stop(ref_grid->mpi,"spl int");
    }
    uVar4 = ref_subdiv_create(&local_f0,ref_grid);
    if (uVar4 == 0) {
      local_f0->new_mark_allowed = 0;
      local_f0->instrument = 1;
      if (0 < local_e8->n) {
        lVar16 = 0;
        local_d0 = ref_mpi;
        do {
          node0 = local_e0->e2n[(long)local_e8->value[lVar16] * 2];
          node1 = local_e0->e2n[local_e8->value[lVar16] * 2 + 1];
          uVar4 = ref_cell_has_side(ref_grid->cell[8],node0,node1,&local_10c);
          if (uVar4 != 0) {
            uVar9 = (ulong)uVar4;
            pcVar11 = "has side";
            uVar8 = 0x16f;
            goto LAB_001e3e5b;
          }
          if ((local_10c != 0) &&
             (uVar4 = ref_subdiv_mark_to_split(local_f0,node0,node1), uVar4 != 0)) {
            uVar9 = (ulong)uVar4;
            pcVar11 = "mark edge to para split";
            uVar8 = 0x173;
            goto LAB_001e3e5b;
          }
          lVar16 = lVar16 + 1;
          ref_mpi = local_d0;
        } while (lVar16 < local_e8->n);
      }
      uVar4 = ref_subdiv_split(local_f0);
      if (uVar4 == 0) {
        uVar4 = ref_subdiv_free(local_f0);
        if (uVar4 == 0) {
          local_90 = local_b8->n;
          uVar4 = ref_mpi_allsum(ref_mpi,&local_90,1,1);
          if (uVar4 == 0) {
            if (ref_mpi->id == 0) {
              printf("cavities with part constraints %d\n",(ulong)local_90);
            }
            ref_list_free(local_e8);
            ref_list_free(local_b8);
            goto LAB_001e4e30;
          }
          uVar9 = (ulong)uVar4;
          pcVar11 = "cavs";
          uVar8 = 0x17c;
        }
        else {
          uVar9 = (ulong)uVar4;
          pcVar11 = "free";
          uVar8 = 0x177;
        }
      }
      else {
        uVar9 = (ulong)uVar4;
        pcVar11 = "split";
        uVar8 = 0x176;
      }
    }
    else {
      uVar9 = (ulong)uVar4;
      pcVar11 = "create";
      uVar8 = 0x167;
    }
LAB_001e3e5b:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar8,
           "ref_split_pass",uVar9,pcVar11);
    return (REF_STATUS)uVar9;
  }
LAB_001e4e30:
  ref_edge_free(local_e0);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_pass(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *ratio;
  REF_INT *edges, *order;
  REF_INT i, n, edge;
  REF_BOOL allowed_ratio, allowed_tri_conformity, allowed_tet_quality;
  REF_BOOL allowed, allowed_local, geom_support, valid_cavity, try_cavity;
  REF_BOOL allowed_cavity_ratio, has_edge;
  REF_BOOL allowed_tri_quality;
  REF_DBL min_del, min_add;
  REF_GLOB global;
  REF_INT node0, node1;
  REF_INT new_node;
  REF_CAVITY ref_cavity = (REF_CAVITY)NULL;
  REF_BOOL span_parts;
  REF_LIST para_no_geom = NULL;
  REF_LIST para_cavity = NULL;
  REF_SUBDIV ref_subdiv = NULL;
  REF_STATUS status;
  REF_BOOL transcript = REF_FALSE;
  REF_DBL ratio01, ratio0, ratio1, weight_node1;

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid))
    ref_cell = ref_grid_tri(ref_grid);

  span_parts = ref_mpi_para(ref_grid_mpi(ref_grid)) &&
               !ref_grid_twod(ref_grid) && !ref_grid_surf(ref_grid);

  if (span_parts) {
    RSS(ref_list_create(&para_no_geom), "list for stuck edges");
    RSS(ref_list_create(&para_cavity), "list for stuck cavity");
  }

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc(ratio, ref_edge_n(ref_edge), REF_DBL);
  ref_malloc(order, ref_edge_n(ref_edge), REF_INT);
  ref_malloc(edges, ref_edge_n(ref_edge), REF_INT);

  n = 0;
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &(ratio[n])), "ratio");
    if (ratio[n] > ref_grid_adapt(ref_grid, split_ratio)) {
      edges[n] = edge;
      n++;
    }
  }

  RSS(ref_sort_heap_dbl(n, ratio, order), "sort lengths");

  for (i = n - 1; i >= 0; i--) {
    edge = edges[order[i]];
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);

    /* transcript = (ratio[order[i]] > 3.0); */
    if (transcript) printf("transcript on ratio %f\n", ratio[order[i]]);

    RSS(ref_cell_has_side(ref_cell, node0, node1, &allowed), "has side");
    if (transcript && !allowed) printf("not a side anymore\n");
    if (!allowed) continue;

    /* skip if neither node is owned */
    if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1)) {
      if (transcript) printf("neither node is local\n");
      continue;
    }

    RSS(ref_split_edge_mixed(ref_grid, node0, node1, &allowed), "mixed");
    if (transcript && !allowed) printf("mixed edge\n");
    if (!allowed) continue;

    weight_node1 = 0.5;
    if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
      RSS(ref_node_ratio(ref_node, node0, node1, &ratio01), "ratio01");
      RSS(ref_node_ratio_node0(ref_node, node0, node1, &ratio0), "ratio0");
      RSS(ref_node_ratio_node0(ref_node, node1, node0, &ratio1), "ratio1");
      if (ref_math_divisible(ratio0, ratio1 + ratio0)) {
        if (0.25 < ratio0 / (ratio0 + ratio1) &&
            ratio0 / (ratio0 + ratio1) < 0.75) {
          weight_node1 = 1.0 - ratio0 / (ratio0 + ratio1);
        } else {
          if (ratio0 < ratio1) {
            if (ref_math_divisible(ratio0, ratio01))
              weight_node1 = 1.0 - ratio0 / ratio01;
          } else {
            if (ref_math_divisible(ratio1, ratio01))
              weight_node1 = ratio1 / ratio01;
          }
        }
      }
    }
    weight_node1 = MIN(0.95, MAX(0.05, weight_node1));
    if (transcript) printf("weight_node1 %f\n", weight_node1);

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &new_node), "new node");
    RSS(ref_node_interpolate_edge(ref_node, node0, node1, weight_node1,
                                  new_node),
        "interp new node");
    RSS(ref_geom_add_between(ref_grid, node0, node1, weight_node1, new_node),
        "geom new node");
    RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
    RSS(ref_metric_interpolate_between(ref_grid, node0, node1, new_node),
        "interp new node metric");
    RSS(ref_geom_supported(ref_grid_geom(ref_grid), new_node, &geom_support),
        "geom support");
    if (transcript && geom_support) printf("geom support\n");

    if (transcript) {
      REF_DBL d0, d1;
      d0 = sqrt(pow(ref_node_xyz(ref_node, 0, node0) -
                        ref_node_xyz(ref_node, 0, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 1, node0) -
                        ref_node_xyz(ref_node, 1, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 2, node0) -
                        ref_node_xyz(ref_node, 2, new_node),
                    2));
      d1 = sqrt(pow(ref_node_xyz(ref_node, 0, node1) -
                        ref_node_xyz(ref_node, 0, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 1, node1) -
                        ref_node_xyz(ref_node, 1, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 2, node1) -
                        ref_node_xyz(ref_node, 2, new_node),
                    2));
      printf("w1 %f xyz %f %f %f d %f %f\nbetween %f %f %f %f %f %f\n",
             weight_node1, ref_node_xyz(ref_node, 0, new_node),
             ref_node_xyz(ref_node, 1, new_node),
             ref_node_xyz(ref_node, 2, new_node), d0, d1,
             ref_node_xyz(ref_node, 0, node0), ref_node_xyz(ref_node, 1, node0),
             ref_node_xyz(ref_node, 2, node0), ref_node_xyz(ref_node, 0, node1),
             ref_node_xyz(ref_node, 1, node1),
             ref_node_xyz(ref_node, 2, node1));
    }

    RSS(ref_split_edge_tet_quality(ref_grid, node0, node1, new_node,
                                   &allowed_tet_quality),
        "edge tet qual");
    if (transcript && !allowed_tet_quality) printf("tet quality poor\n");

    RSS(ref_split_edge_tri_quality(ref_grid, node0, node1, new_node,
                                   &allowed_tri_quality),
        "quality of new tri");
    if (transcript && !allowed_tri_quality) printf("tri quality poor\n");

    RSS(ref_split_edge_ratio(ref_grid, node0, node1, new_node, &allowed_ratio),
        "edge tet ratio");
    if (transcript && !allowed_ratio) printf("ratio poor\n");

    RSS(ref_split_edge_tri_conformity(transcript, ref_grid, node0, node1,
                                      new_node, &allowed_tri_conformity),
        "edge tri qual");
    if (transcript && !allowed_tri_conformity) printf("tri conformity poor\n");

    RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node0, node1, &has_edge),
        "check for an edge");
    if (transcript && has_edge) printf("has geom edge\n");

    try_cavity = REF_FALSE;
    if (!allowed_tet_quality || !allowed_ratio || !allowed_tri_conformity ||
        !allowed_tri_quality) {
      if (geom_support) {
        try_cavity = REF_TRUE;
      } else {
        RSS(ref_node_remove(ref_node, new_node), "remove new node");
        RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
        continue;
      }
    }

    if (try_cavity) {
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      ref_cavity_debug(ref_cavity) = transcript;
      if (ref_grid_surf(ref_grid) && has_edge) {
        RSS(ref_node_ratio(ref_node, node0, node1, &ratio01), "ratio01");
        if (ratio01 > 5.0) ref_cavity_min_normdev(ref_cavity) = 0.0;
      }
      RSS(ref_cavity_form_edge_split(ref_cavity, ref_grid, node0, node1,
                                     new_node),
          "form edge split cav");
      if (transcript) {
        REF_BOOL normdev_improved;
        RSS(ref_cavity_normdev(ref_cavity, &normdev_improved), "nd");
        printf("form cavity status %d min normdev %f\n",
               (int)ref_cavity_state(ref_cavity),
               ref_cavity_min_normdev(ref_cavity));
      }
      if (REF_SUCCESS != ref_cavity_enlarge_combined(ref_cavity)) {
        RSS(ref_grid_tattle(ref_grid, node0), "tattle node0");
        RSS(ref_grid_tattle(ref_grid, node1), "tattle node1");
        REF_WHERE("enlarge"); /* note but skip cavity failures */
      }
      if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
        if (transcript) printf("cavity visible\n");
        RSS(ref_cavity_ratio(ref_cavity, &allowed_cavity_ratio),
            "cavity ratio");
        RSS(ref_cavity_change(ref_cavity, &min_del, &min_add), "cavity change");
        valid_cavity =
            (allowed_cavity_ratio || has_edge) &&
            (min_add > ref_grid_adapt(ref_grid, split_quality_absolute));
        if (transcript && !valid_cavity)
          printf("valid_cavity edge %d ratio %d add %d %f\n", has_edge,
                 allowed_cavity_ratio,
                 (min_add > ref_grid_adapt(ref_grid, split_quality_absolute)),
                 min_add);

        if (valid_cavity) {
          if (transcript) printf("cavity replace\n");
          RSS(ref_cavity_replace(ref_cavity), "cav replace");
          RSS(ref_cavity_free(ref_cavity), "cav free");
          ref_cavity = (REF_CAVITY)NULL;
          ref_node_age(ref_node, node0) = 0;
          ref_node_age(ref_node, node1) = 0;
          RSS(ref_smooth_post_edge_split(ref_grid, new_node),
              "smooth after split");
          continue;
        }
      } else {
        if (transcript) {
          REF_BOOL normdev_improved;
          RSS(ref_cavity_normdev(ref_cavity, &normdev_improved), "nd");
          printf("cavity not visible %d\n", (int)ref_cavity_state(ref_cavity));
        }
      }
      if (REF_CAVITY_PARTITION_CONSTRAINED == ref_cavity_state(ref_cavity)) {
        if (span_parts) RSS(ref_list_push(para_cavity, edge), "push");
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
      ref_cavity = (REF_CAVITY)NULL;
      RSS(ref_node_remove(ref_node, new_node), "remove new node");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
      continue;
    }

    RSS(ref_cell_local_gem(ref_cell, ref_node, node0, node1, &allowed_local),
        "local tet");
    if (!allowed_local) {
      if (span_parts) {
        RSS(ref_list_push(para_no_geom, edge), "push");
      } else {
        ref_node_age(ref_node, node0)++;
        ref_node_age(ref_node, node1)++;
      }
      RSS(ref_node_remove(ref_node, new_node), "remove new node");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
      continue;
    }

    if (transcript) printf("split\n");
    status = ref_split_edge(ref_grid, node0, node1, new_node);
    if (REF_INCREASE_LIMIT == status) {
      RSS(ref_node_remove(ref_node, new_node), "remove new node");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
      continue;
    }
    RSS(status, "tet edge split");

    if (transcript)
      RSS(ref_split_edge_ratio_post_report(ref_grid, node0, node1, new_node),
          "report ratio");
    ref_node_age(ref_node, node0) = 0;
    ref_node_age(ref_node, node1) = 0;

    RSS(ref_smooth_post_edge_split(ref_grid, new_node), "smooth after split");
  }

  ref_free(edges);
  ref_free(order);
  ref_free(ratio);

  if (span_parts) {
    if (ref_grid_adapt(ref_grid, timing_level) > 0)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "spl int");
    RSS(ref_subdiv_create(&ref_subdiv, ref_grid), "create");
    ref_subdiv_new_mark_allowed(ref_subdiv) = REF_FALSE;
    ref_subdiv->instrument = REF_TRUE;
    each_ref_list_item(para_no_geom, i) {
      edge = ref_list_value(para_no_geom, i);
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &allowed),
          "has side");
      if (!allowed) continue;

      RSS(ref_subdiv_mark_to_split(ref_subdiv, node0, node1),
          "mark edge to para split");
    }

    RSS(ref_subdiv_split(ref_subdiv), "split");
    RSS(ref_subdiv_free(ref_subdiv), "free");

    {
      REF_INT n_cavity;
      n_cavity = ref_list_n(para_cavity);
      RSS(ref_mpi_allsum(ref_mpi, &n_cavity, 1, REF_INT_TYPE), "cavs");
      if (ref_mpi_once(ref_mpi))
        printf("cavities with part constraints %d\n", n_cavity);
    }

    ref_list_free(para_no_geom);
    ref_list_free(para_cavity);
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}